

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_textedit_locate_coord(nk_text_edit *edit,float x,float y,nk_user_font *font,float row_height)

{
  int iVar1;
  nk_rune nVar2;
  int char_id;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float local_60;
  nk_text_edit_row local_50;
  nk_str *local_38;
  
  iVar5 = (edit->string).len;
  local_50.x0 = 0.0;
  local_50.x1 = 0.0;
  local_50.ymin = 0.0;
  local_50.ymax = 0.0;
  local_50.num_chars = 0;
  local_38 = &edit->string;
  fVar6 = 0.0;
  iVar4 = 0;
  while( true ) {
    if (iVar5 <= iVar4) {
      return iVar5;
    }
    nk_textedit_layout_row(&local_50,edit,iVar4,row_height,font);
    iVar1 = local_50.num_chars;
    if (local_50.num_chars < 1) break;
    if ((iVar4 == 0) && (y < local_50.ymin + fVar6)) {
      return 0;
    }
    if (y < local_50.ymax + fVar6) {
      if (x < local_50.x0) {
        return iVar4;
      }
      iVar5 = iVar4;
      if (x < local_50.x1) {
        local_60 = local_50.x0;
        char_id = 0;
        for (iVar3 = 0; iVar5 = iVar1, iVar1 + iVar3 != 0; iVar3 = iVar3 + -1) {
          fVar6 = nk_textedit_get_width(edit,iVar4,char_id,font);
          if (x < local_60 + fVar6) {
            if (x < local_60 + fVar6 * 0.5) {
              return iVar4 - iVar3;
            }
            return (iVar4 - iVar3) + 1;
          }
          char_id = char_id + 1;
          local_60 = local_60 + fVar6;
        }
      }
      iVar4 = iVar1 + iVar5 + -1;
      nVar2 = nk_str_rune_at(local_38,iVar4);
      if (nVar2 != 10) {
        return iVar1 + iVar5;
      }
      return iVar4;
    }
    iVar4 = iVar4 + local_50.num_chars;
    fVar6 = fVar6 + local_50.baseline_y_delta;
  }
  return iVar5;
}

Assistant:

NK_INTERN int
nk_textedit_locate_coord(struct nk_text_edit *edit, float x, float y,
    const struct nk_user_font *font, float row_height)
{
    struct nk_text_edit_row r;
    int n = edit->string.len;
    float base_y = 0, prev_x;
    int i=0, k;

    r.x0 = r.x1 = 0;
    r.ymin = r.ymax = 0;
    r.num_chars = 0;

    /* search rows to find one that straddles 'y' */
    while (i < n) {
        nk_textedit_layout_row(&r, edit, i, row_height, font);
        if (r.num_chars <= 0)
            return n;

        if (i==0 && y < base_y + r.ymin)
            return 0;

        if (y < base_y + r.ymax)
            break;

        i += r.num_chars;
        base_y += r.baseline_y_delta;
    }

    /* below all text, return 'after' last character */
    if (i >= n)
        return n;

    /* check if it's before the beginning of the line */
    if (x < r.x0)
        return i;

    /* check if it's before the end of the line */
    if (x < r.x1) {
        /* search characters in row for one that straddles 'x' */
        k = i;
        prev_x = r.x0;
        for (i=0; i < r.num_chars; ++i) {
            float w = nk_textedit_get_width(edit, k, i, font);
            if (x < prev_x+w) {
                if (x < prev_x+w/2)
                    return k+i;
                else return k+i+1;
            }
            prev_x += w;
        }
        /* shouldn't happen, but if it does, fall through to end-of-line case */
    }

    /* if the last character is a newline, return that.
     * otherwise return 'after' the last character */
    if (nk_str_rune_at(&edit->string, i+r.num_chars-1) == '\n')
        return i+r.num_chars-1;
    else return i+r.num_chars;
}